

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O2

void __thiscall CCharmapToUni::load_table(CCharmapToUni *this,osfildef *fp)

{
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uchar buf [256];
  
  sVar1 = fread(buf,6,1,(FILE *)fp);
  if (sVar1 == 1) {
    for (uVar2 = (uint)(ushort)buf._4_2_; uVar2 != 0; uVar2 = uVar2 - (int)uVar4) {
      uVar4 = 0x40;
      if (uVar2 < 0x40) {
        uVar4 = (ulong)uVar2;
      }
      sVar1 = fread(buf,(ulong)(uint)((int)uVar4 * 4),1,(FILE *)fp);
      if (sVar1 != 1) {
        return;
      }
      for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        (*(this->super_CCharmap)._vptr_CCharmap[7])
                  (this,(ulong)*(ushort *)(buf + uVar3 * 4),(ulong)*(ushort *)(buf + uVar3 * 4 + 2))
        ;
      }
    }
  }
  return;
}

Assistant:

void CCharmapToUni::load_table(osfildef *fp)
{
    uchar buf[256];
    uint entry_cnt;

    /* read the header and the local table header */
    if (osfrb(fp, buf, 6))
        return;

    /* get the local table size from the local table header */
    entry_cnt = osrp2(buf + 4);

    /* read the mappings */
    while (entry_cnt > 0)
    {
        size_t cur;
        const uchar *p;

        /* figure out how many entries we can read this time */
        cur = sizeof(buf)/4;
        if (cur > entry_cnt)
            cur = entry_cnt;

        /* read the entries */
        if (osfrb(fp, buf, cur*4))
            return;

        /* deduct this number from the remaining count */
        entry_cnt -= cur;

        /* scan the entries */
        for (p = buf ; cur > 0 ; p += 4, --cur)
        {
            /* map this entry */
            set_mapping(osrp2(p), osrp2(p+2));
        }
    }
}